

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 normalizeRoundAndPackFloatx80_arm
                   (int8_t roundingPrecision,flag zSign,int32_t zExp,uint64_t zSig0,uint64_t zSig1,
                   float_status *status)

{
  byte bVar1;
  ulong zSig0_00;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  floatx80 fVar5;
  
  uVar3 = zSig1;
  zSig0_00 = zSig0;
  if (zSig0 == 0) {
    uVar3 = 0;
    zSig0_00 = zSig1;
  }
  if (zSig0_00 == 0) {
    uVar4 = 0x40;
  }
  else {
    uVar4 = 0x3f;
    if (zSig0_00 != 0) {
      for (; zSig0_00 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = uVar4 ^ 0x3f;
  }
  bVar1 = (byte)uVar4;
  if (uVar4 != 0) {
    zSig0_00 = zSig0_00 << (bVar1 & 0x3f) | uVar3 >> (-bVar1 & 0x3f);
  }
  iVar2 = zExp + -0x40;
  if (zSig0 != 0) {
    iVar2 = zExp;
  }
  fVar5 = roundAndPackFloatx80_arm
                    (roundingPrecision,zSign,iVar2 - (int)uVar4,zSig0_00,uVar3 << (bVar1 & 0x3f),
                     status);
  return fVar5;
}

Assistant:

floatx80 normalizeRoundAndPackFloatx80(int8_t roundingPrecision,
                                       flag zSign, int32_t zExp,
                                       uint64_t zSig0, uint64_t zSig1,
                                       float_status *status)
{
    int8_t shiftCount;

    if ( zSig0 == 0 ) {
        zSig0 = zSig1;
        zSig1 = 0;
        zExp -= 64;
    }
    shiftCount = clz64(zSig0);
    shortShift128Left( zSig0, zSig1, shiftCount, &zSig0, &zSig1 );
    zExp -= shiftCount;
    return roundAndPackFloatx80(roundingPrecision, zSign, zExp,
                                zSig0, zSig1, status);

}